

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O1

double __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
empirical_cost(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
               *this)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  
  iVar1 = this->num_inserts_;
  iVar2 = this->num_lookups_ + iVar1;
  if (iVar2 != 0) {
    dVar4 = (double)iVar2;
    auVar5._0_8_ = (double)this->num_exp_search_iterations_ / dVar4;
    auVar5._8_8_ = (double)this->num_exp_search_iterations_;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = ((double)iVar1 / dVar4) *
                   (double)((ulong)(iVar1 != 0) *
                           (long)(((double)this->num_shifts_ / (double)iVar1) * 0.5));
    auVar3 = vfmadd231sd_fma(auVar3,auVar5,ZEXT816(0x4034000000000000));
    return auVar3._0_8_;
  }
  return 0.0;
}

Assistant:

double empirical_cost() const {
    if (num_inserts_ + num_lookups_ == 0) {
      return 0;
    }
    double frac_inserts =
        static_cast<double>(num_inserts_) / (num_inserts_ + num_lookups_);
    return kExpSearchIterationsWeight * exp_search_iterations_per_operation() +
           kShiftsWeight * shifts_per_insert() * frac_inserts;
  }